

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__writer.cc
# Opt level: O0

bool __thiscall xemmai::io::t_writer::f_write_line(t_writer *this,t_io *a_library,t_pvalue *a_value)

{
  anon_class_24_3_3c0585e9 a_do;
  bool bVar1;
  t_pvalue *a_value_local;
  t_io *a_library_local;
  t_writer *this_local;
  
  a_do.a_library = (t_io **)&a_value_local;
  a_do.this = this;
  a_do.a_value = a_value;
  a_value_local = (t_pvalue *)a_library;
  a_library_local = (t_io *)this;
  bVar1 = t_sharable::
          f_owned_or_shared<xemmai::t_lock_with_safe_region,xemmai::io::t_writer::f_write_line(xemmai::t_io*,xemmai::t_value<xemmai::t_pointer>const&)::__0>
                    (&this->super_t_sharable,a_do);
  return bVar1;
}

Assistant:

bool t_writer::f_write_line(t_io* a_library, const t_pvalue& a_value)
{
	return f_owned_or_shared<t_lock_with_safe_region>([&]
	{
		auto b = f__write(a_library, a_value);
		v_step = 4;
		return b && f__resume(a_library);
	});
}